

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int __thiscall
doctest::detail::MultiLaneAtomic<int>::load(MultiLaneAtomic<int> *this,memory_order order)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x800; lVar2 = lVar2 + 0x40) {
    iVar1 = iVar1 + *(int *)(this->m_atomics[0].padding + lVar2 + -4);
  }
  return iVar1;
}

Assistant:

T load(std::memory_order order = std::memory_order_seq_cst) const DOCTEST_NOEXCEPT {
            auto result = T();
            for(auto const& c : m_atomics) {
                result += c.atomic.load(order);
            }
            return result;
        }